

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Ibcast(void *buffer,int count,MPIABI_Datatype datatype,int root,MPIABI_Comm comm,
                 MPIABI_Request *request)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  ompi_communicator_t *poVar3;
  ompi_request_t **ppoVar4;
  WPI_HandlePtr<ompi_request_t_*> local_50;
  WPI_Handle local_48 [8];
  WPI_Handle local_40 [8];
  MPIABI_Request *local_38;
  MPIABI_Request *request_local;
  MPIABI_Comm comm_local;
  MPIABI_Datatype MStack_20;
  int root_local;
  MPIABI_Datatype datatype_local;
  void *pvStack_10;
  int count_local;
  void *buffer_local;
  
  local_38 = request;
  request_local = (MPIABI_Request *)comm;
  comm_local._4_4_ = root;
  MStack_20 = datatype;
  datatype_local._4_4_ = count;
  pvStack_10 = buffer;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_40,datatype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_40);
  iVar1 = comm_local._4_4_;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle
            ((WPI_Handle<ompi_communicator_t_*> *)local_48,(uintptr_t)request_local);
  poVar3 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_48);
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_50,local_38);
  ppoVar4 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_50);
  iVar1 = MPI_Ibcast(buffer,count,poVar2,iVar1,poVar3,ppoVar4);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_50);
  return iVar1;
}

Assistant:

int MPIABI_Ibcast(
  void * buffer,
  int count,
  MPIABI_Datatype datatype,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Ibcast(
    buffer,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}